

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O1

void __thiscall
DListBase<ThreadContext::CollectCallBack,_RealCount>::RemoveElement<Memory::HeapAllocator>
          (DListBase<ThreadContext::CollectCallBack,_RealCount> *this,HeapAllocator *allocator,
          CollectCallBack *element)

{
  code *pcVar1;
  bool bVar2;
  DListNode<ThreadContext::CollectCallBack> *pDVar3;
  undefined4 *puVar4;
  DListNode<ThreadContext::CollectCallBack> *buffer;
  
  buffer = (DListNode<ThreadContext::CollectCallBack> *)(element + -1);
  pDVar3 = (DListNode<ThreadContext::CollectCallBack> *)this;
  do {
    pDVar3 = (pDVar3->super_DListNodeBase<ThreadContext::CollectCallBack>).next.node;
    if (pDVar3 == (DListNode<ThreadContext::CollectCallBack> *)this) break;
  } while (pDVar3 != buffer);
  if (pDVar3 == (DListNode<ThreadContext::CollectCallBack> *)this) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                       ,0x175,"(HasNode(node))","HasNode(node)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  *(anon_union_8_3_7fb8a913_for_next *)element[-1].context =
       (buffer->super_DListNodeBase<ThreadContext::CollectCallBack>).next;
  ((buffer->super_DListNodeBase<ThreadContext::CollectCallBack>).next.base)->prev =
       (anon_union_8_3_7fb8a913_for_prev)element[-1].context;
  Memory::HeapAllocator::Free(allocator,buffer,0x20);
  (this->super_RealCount).count = (this->super_RealCount).count - 1;
  return;
}

Assistant:

void RemoveElement(TAllocator * allocator, TData * element)
    {
        Node * node = CONTAINING_RECORD(element, Node, data);
#if DBG_DUMP
        Assert(HasNode(node));
#endif
        DListBase::RemoveNode(node);
        AllocatorDelete(TAllocator, allocator, node);

        this->DecrementCount();

    }